

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O1

unsigned_long om::file::size(string *file_name_)

{
  int iVar1;
  runtime_error *this;
  int *piVar2;
  stat st;
  string sStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  stat local_a8;
  
  memset(&local_a8,0,0x90);
  iVar1 = stat((file_name_->_M_dataplus)._M_p,&local_a8);
  if (-1 < iVar1) {
    return local_a8.st_size;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  piVar2 = __errno_location();
  std::__cxx11::to_string(&sStack_e8,*piVar2);
  std::operator+(&local_c8,"size: could not determine file size: errno: ",&sStack_e8);
  std::runtime_error::runtime_error(this,(string *)&local_c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline unsigned long size(const std::string& file_name_)
		{
			struct stat st {};

			if (stat(file_name_.c_str(), &st) < 0)
				throw std::runtime_error("size: could not determine file size: errno: "
										 + std::to_string(errno));

			return (unsigned long)(st.st_size);
		}